

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall Graph<Node>::currCC(Graph<Node> *this,vector<int> *cc,vector<bool> *used,int *node)

{
  int iVar1;
  int iVar2;
  bool *pbVar3;
  NodeList<Node> *pNVar4;
  Node *this_00;
  int local_30;
  int local_2c;
  int nxtNode;
  int nxtInd;
  int *node_local;
  vector<bool> *used_local;
  vector<int> *cc_local;
  Graph<Node> *this_local;
  
  _nxtNode = node;
  node_local = (int *)used;
  used_local = (vector<bool> *)cc;
  cc_local = (vector<int> *)this;
  vector<int>::push_back(cc,node);
  pbVar3 = vector<bool>::operator[]((vector<bool> *)node_local,_nxtNode);
  *pbVar3 = true;
  local_2c = 0;
  while( true ) {
    iVar1 = local_2c;
    pNVar4 = vector<NodeList<Node>_>::operator[](&this->G,_nxtNode);
    iVar2 = NodeList<Node>::size(pNVar4);
    if (iVar2 <= iVar1) break;
    pNVar4 = vector<NodeList<Node>_>::operator[](&this->G,_nxtNode);
    this_00 = NodeList<Node>::operator[](pNVar4,&local_2c);
    local_30 = Node::getIndex(this_00);
    pbVar3 = vector<bool>::operator[]((vector<bool> *)node_local,&local_30);
    if ((*pbVar3 & 1U) == 0) {
      currCC(this,(vector<int> *)used_local,(vector<bool> *)node_local,&local_30);
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void currCC(vector <int> &cc, vector <bool> &used, const int &node) {
        cc.push_back(node);
        used[node] = true;

        for (int nxtInd = 0; nxtInd < G[node].size(); ++nxtInd) {
            int nxtNode = G[node][nxtInd].getIndex();

            if (!used[nxtNode]) {
                currCC(cc, used, nxtNode);
            }
        }
    }